

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
          (StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,basic_string_view<char,_std::char_traits<char>_> *args)

{
  allocator<char> *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  allocator<char> local_11;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  
  __t = in_RDI;
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::blockCheck(in_stack_ffffffffffffffd0);
  *(int *)&in_RDI[1]._M_str = *(int *)&in_RDI[1]._M_str + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (unaff_retaddr,__t,in_RSI);
  std::allocator<char>::~allocator(&local_11);
  in_RDI->_M_len = in_RDI->_M_len + 1;
  return;
}

Assistant:

void emplace_back(Args&&... args)
        {
            blockCheck();
            new (&(dataptr[dataSlotIndex][bsize++]))
                X(std::forward<Args>(args)...);
            ++csize;
        }